

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::End(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  ImGuiContext *g;
  char *__function;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  Columns(1,"#CloseColumns",true);
  PopClipRect();
  if ((pIVar2->Flags & 0x100000) == 0) {
    LogFinish();
  }
  iVar1 = (pIVar3->CurrentWindowStack).Size;
  if (0 < iVar1) {
    uVar5 = iVar1 - 1;
    (pIVar3->CurrentWindowStack).Size = uVar5;
    if ((pIVar2->Flags & 0x2000000) != 0) {
      iVar1 = (pIVar3->CurrentPopupStack).Size;
      if (iVar1 < 1) {
        __function = "void ImVector<ImGuiPopupRef>::pop_back() [T = ImGuiPopupRef]";
        goto LAB_00133738;
      }
      (pIVar3->CurrentPopupStack).Size = iVar1 + -1;
    }
    pIVar4 = GImGui;
    if ((pIVar2->DC).StackSizesBackup[0] != (pIVar2->IDStack).Size) {
      __assert_fail("*p_backup == current && \"PushID/PopID Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0xe59,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar2->DC).StackSizesBackup[1] != (pIVar2->DC).GroupStack.Size) {
      __assert_fail("*p_backup == current && \"BeginGroup/EndGroup Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0xe5a,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar2->DC).StackSizesBackup[2] != (GImGui->CurrentPopupStack).Size) {
      __assert_fail("*p_backup == current && \"BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0xe5b,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar2->DC).StackSizesBackup[3] == (GImGui->ColorModifiers).Size) {
      if ((pIVar2->DC).StackSizesBackup[4] != (GImGui->StyleModifiers).Size) {
        __assert_fail("*p_backup == current && \"PushStyleVar/PopStyleVar Mismatch!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                      ,0xe5d,"void CheckStacksSize(ImGuiWindow *, bool)");
      }
      if ((pIVar2->DC).StackSizesBackup[5] == (GImGui->FontStack).Size) {
        if (uVar5 == 0) {
          GImGui->CurrentWindow = (ImGuiWindow *)0x0;
        }
        else {
          pIVar2 = (pIVar3->CurrentWindowStack).Data[(ulong)uVar5 - 1];
          GImGui->CurrentWindow = pIVar2;
          if (pIVar2 != (ImGuiWindow *)0x0) {
            pIVar4->FontSize = pIVar4->FontBaseSize * pIVar2->FontWindowScale;
          }
        }
        return;
      }
      __assert_fail("*p_backup == current && \"PushFont/PopFont Mismatch!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0xe5e,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    __assert_fail("*p_backup == current && \"PushStyleColor/PopStyleColor Mismatch!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0xe5c,"void CheckStacksSize(ImGuiWindow *, bool)");
  }
  __function = "void ImVector<ImGuiWindow *>::pop_back() [T = ImGuiWindow *]";
LAB_00133738:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                ,0x370,__function);
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    Columns(1, "#CloseColumns");
    PopClipRect();   // inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop
    // NB: we don't clear 'window->RootWindow'. The pointer is allowed to live until the next call to Begin().
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.CurrentPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}